

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::CmpHelperEqIterator<int*,char*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,char *b2,char *e2)

{
  pointer pcVar1;
  int iVar2;
  iuStreamMessage *piVar3;
  AssertionResult *pAVar4;
  int *piVar5;
  AssertionResult *pAVar6;
  bool bVar7;
  bool bVar8;
  Message ar;
  int local_3b0;
  uint local_3ac;
  ios_base *local_3a8;
  AssertionResult *local_3a0;
  iuutil *local_398;
  int *local_390;
  AssertionResult local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [32];
  bool local_320;
  ios_base local_2c0 [264];
  undefined1 local_1b8 [392];
  
  piVar5 = e1;
  local_3a0 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  local_3b0 = 0;
  bVar7 = this != (iuutil *)b1;
  bVar8 = e1 != (int *)b2;
  local_398 = (iuutil *)b1;
  if (bVar7 && bVar8) {
    local_3a8 = local_2c0;
    local_3ac = (uint)CONCAT71((int7)((ulong)local_3a8 >> 8),1);
    do {
      iutest::internal::CmpHelperEQ<int,char>(&local_388,(internal *)0x16f1ca,"",(char *)this,e1,e2)
      ;
      iutest::AssertionResult::operator!((AssertionResult *)local_340,&local_388);
      bVar8 = local_320;
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
        operator_delete(local_388.m_message._M_dataplus._M_p,
                        local_388.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar8 != false) {
        piVar3 = iutest::detail::iuStreamMessage::operator<<
                           ((iuStreamMessage *)local_1b8,(char (*) [25])"\nMismatch in a position ")
        ;
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,&local_3b0);
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [3])0x16ce2a);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        local_390 = e1;
        std::ostream::operator<<(local_340 + 0x10,*(int *)this);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a8);
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,&local_388.m_message);
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [5])" vs ");
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        iutest::detail::PrintToChar<signed_char>((char)*local_390,(iu_ostream *)(local_340 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a8);
        iutest::detail::iuStreamMessage::operator<<(piVar3,&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
          operator_delete(local_388.m_message._M_dataplus._M_p,
                          local_388.m_message.field_2._M_allocated_capacity + 1);
        }
        local_3ac = 0;
        e1 = local_390;
      }
      this = this + 4;
      e1 = (int *)((long)e1 + 1);
      local_3b0 = local_3b0 + 1;
      bVar8 = e1 != (int *)b2;
      bVar7 = this != local_398;
    } while ((bVar7) && (e1 != (int *)b2));
  }
  else {
    local_3ac = (uint)CONCAT71((uint7)((ulong)piVar5 >> 8) & 0xffffff,1);
  }
  if (bVar7) {
    iVar2 = local_3b0;
    if (this != local_398) {
      iVar2 = local_3b0 + (int)((ulong)(local_398 + (0x3fffffffc - (long)this)) >> 2) + 1;
    }
    local_340._0_4_ = iVar2;
    piVar3 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(int *)local_340);
    piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar3,&local_3b0);
    if (bVar8) {
LAB_00164aca:
      iVar2 = ((int)b2 + local_3b0) - (int)e1;
      if (e1 == (int *)b2) {
        iVar2 = local_3b0;
      }
      local_340._0_4_ = iVar2;
      piVar3 = iutest::detail::iuStreamMessage::operator<<
                         ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
      piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,&local_3b0);
      piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [5])" vs ");
      iutest::detail::iuStreamMessage::operator<<(piVar3,(int *)local_340);
    }
  }
  else {
    if (bVar8) goto LAB_00164aca;
    if ((local_3ac & 1) != 0) {
      (local_3a0->m_message)._M_dataplus._M_p = (pointer)&(local_3a0->m_message).field_2;
      (local_3a0->m_message)._M_string_length = 0;
      (local_3a0->m_message).field_2._M_local_buf[0] = '\0';
      local_3a0->m_result = true;
      pAVar6 = local_3a0;
      goto LAB_00164bbc;
    }
  }
  local_340._0_8_ = local_340 + 0x10;
  local_340._8_8_ = 0;
  local_340[0x10] = '\0';
  local_320 = false;
  pAVar4 = iutest::AssertionResult::operator<<
                     ((AssertionResult *)local_340,(iuStreamMessage *)local_1b8);
  pAVar6 = local_3a0;
  (local_3a0->m_message)._M_dataplus._M_p = (pointer)&(local_3a0->m_message).field_2;
  pcVar1 = (pAVar4->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3a0,pcVar1,pcVar1 + (pAVar4->m_message)._M_string_length);
  pAVar6->m_result = pAVar4->m_result;
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
  }
LAB_00164bbc:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return pAVar6;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}